

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_SamePackageUnusedImportError_Test::
TestBody(ValidationErrorTest_SamePackageUnusedImportError_Test *this)

{
  string_view file_text;
  string_view file_text_00;
  string_view file_name;
  string local_48;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  file_text._M_str =
       "\n    name: \"unused_dependency.proto\"\n    package: \"proto2_unittest.subpackage\"\n    message_type { name: \"Foo\" }\n  "
  ;
  file_text._M_len = 0x72;
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  file_text_00._M_str =
       "\n    name: \"used_dependency.proto\"\n    package: \"proto2_unittest.subpackage\"\n    message_type { name: \"Bar\" }\n  "
  ;
  file_text_00._M_len = 0x70;
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text_00);
  file_name._M_str = "import.proto";
  file_name._M_len = 0xc;
  DescriptorPool::AddDirectInputFile(&(this->super_ValidationErrorTest).pool_,file_name,true);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "\n                        name: \"import.proto\"\n                        package: \"proto2_unittest\"\n                        dependency: \"unused_dependency.proto\"\n                        dependency: \"used_dependency.proto\"\n                        message_type {\n                          name: \"Baz\"\n                          field {\n                            name: \"bar\"\n                            number: 1\n                            label: LABEL_OPTIONAL\n                            type: TYPE_MESSAGE\n                            type_name: \"subpackage.Bar\"\n                          }\n                        }\n                      "
             ,"");
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_28,
            "import.proto: unused_dependency.proto: IMPORT: Import unused_dependency.proto is unused.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_48,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F(ValidationErrorTest, SamePackageUnusedImportError) {
  BuildFile(R"pb(
    name: "unused_dependency.proto"
    package: "proto2_unittest.subpackage"
    message_type { name: "Foo" }
  )pb");

  BuildFile(R"pb(
    name: "used_dependency.proto"
    package: "proto2_unittest.subpackage"
    message_type { name: "Bar" }
  )pb");

  pool_.AddDirectInputFile("import.proto", true);
  BuildFileWithErrors(R"pb(
                        name: "import.proto"
                        package: "proto2_unittest"
                        dependency: "unused_dependency.proto"
                        dependency: "used_dependency.proto"
                        message_type {
                          name: "Baz"
                          field {
                            name: "bar"
                            number: 1
                            label: LABEL_OPTIONAL
                            type: TYPE_MESSAGE
                            type_name: "subpackage.Bar"
                          }
                        }
                      )pb",
                      "import.proto: unused_dependency.proto: "
                      "IMPORT: Import unused_dependency.proto is unused.\n");
}